

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O1

void __thiscall btTriangleMesh::preallocateVertices(btTriangleMesh *this,int numverts)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btVector3 *ptr;
  float *pfVar3;
  undefined8 uVar4;
  btAlignedObjectArray<btVector3> *pbVar5;
  btVector3 *pbVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  
  if (this->m_use4componentVertices == true) {
    if (numverts <= (this->m_4componentVertices).m_capacity) {
      return;
    }
    if (numverts == 0) {
      pbVar6 = (btVector3 *)0x0;
    }
    else {
      pbVar6 = (btVector3 *)btAlignedAllocInternal((long)numverts << 4,0x10);
    }
    lVar8 = (long)(this->m_4componentVertices).m_size;
    if (0 < lVar8) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar9);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar6->m_floats + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 * 0x10 != lVar9);
    }
    ptr = (this->m_4componentVertices).m_data;
    if (ptr != (btVector3 *)0x0) {
      if ((this->m_4componentVertices).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_4componentVertices).m_data = (btVector3 *)0x0;
    }
    pbVar5 = &this->m_4componentVertices;
    (this->m_4componentVertices).m_ownsMemory = true;
    (this->m_4componentVertices).m_data = pbVar6;
  }
  else {
    if (numverts <= (this->m_3componentVertices).m_capacity) {
      return;
    }
    if (numverts == 0) {
      pfVar7 = (float *)0x0;
    }
    else {
      pfVar7 = (float *)btAlignedAllocInternal((long)numverts << 2,0x10);
    }
    lVar8 = (long)(this->m_3componentVertices).m_size;
    if (0 < lVar8) {
      pfVar3 = (this->m_3componentVertices).m_data;
      lVar9 = 0;
      do {
        pfVar7[lVar9] = pfVar3[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    pfVar3 = (this->m_3componentVertices).m_data;
    if (pfVar3 != (float *)0x0) {
      if ((this->m_3componentVertices).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar3);
      }
      (this->m_3componentVertices).m_data = (float *)0x0;
    }
    pbVar5 = (btAlignedObjectArray<btVector3> *)&this->m_3componentVertices;
    (this->m_3componentVertices).m_ownsMemory = true;
    (this->m_3componentVertices).m_data = pfVar7;
  }
  pbVar5->m_capacity = numverts;
  return;
}

Assistant:

void btTriangleMesh::preallocateVertices(int numverts)
{
	if (m_use4componentVertices)
	{
		m_4componentVertices.reserve(numverts);
	} else
	{
		m_3componentVertices.reserve(numverts);
	}
}